

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

char * Curl_checkheaders(Curl_easy *data,char *thisheader,size_t thislen)

{
  curl_slist *pcVar1;
  int iVar2;
  
  pcVar1 = (data->set).headers;
  while( true ) {
    if (pcVar1 == (curl_slist *)0x0) {
      return (char *)0x0;
    }
    iVar2 = curl_strnequal(pcVar1->data,thisheader,thislen);
    if ((iVar2 != 0) && ((pcVar1->data[thislen] & 0xfeU) == 0x3a)) break;
    pcVar1 = pcVar1->next;
  }
  return pcVar1->data;
}

Assistant:

char *Curl_checkheaders(const struct Curl_easy *data,
                        const char *thisheader,
                        const size_t thislen)
{
  struct curl_slist *head;
  DEBUGASSERT(thislen);
  DEBUGASSERT(thisheader[thislen-1] != ':');

  for(head = data->set.headers; head; head = head->next) {
    if(strncasecompare(head->data, thisheader, thislen) &&
       Curl_headersep(head->data[thislen]) )
      return head->data;
  }

  return NULL;
}